

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.hpp
# Opt level: O1

void __thiscall
duckdb::ColumnReader::PlainTemplatedDefines<int,duckdb::TemplatedParquetValueConversion<long>,false>
          (ColumnReader *this,ByteBuffer *plain_data,uint8_t *defines,uint64_t num_values,
          idx_t result_offset,Vector *result)

{
  undefined4 uVar1;
  long lVar2;
  data_ptr_t pdVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  
  if (plain_data->len < num_values * 8) {
    PlainTemplatedInternal<int,duckdb::TemplatedParquetValueConversion<long>,false,true>
              (this,plain_data,defines,num_values,result_offset,result);
    return;
  }
  lVar2 = *(long *)(result + 0x20);
  FlatVector::VerifyFlatVector(result);
  if (result_offset < result_offset + num_values) {
    uVar4 = plain_data->len;
    uVar5 = 0;
    pdVar3 = plain_data->ptr;
    do {
      uVar4 = uVar4 - 8;
      uVar1 = *(undefined4 *)pdVar3;
      plain_data->len = uVar4;
      plain_data->ptr = pdVar3 + 8;
      *(undefined4 *)(lVar2 + result_offset * 4 + uVar5 * 4) = uVar1;
      uVar5 = uVar5 + 1;
      pdVar3 = pdVar3 + 8;
    } while (num_values != uVar5);
  }
  return;
}

Assistant:

void PlainTemplatedDefines(ByteBuffer &plain_data, const uint8_t *defines, uint64_t num_values, idx_t result_offset,
	                           Vector &result) {
		if (CONVERSION::PlainAvailable(plain_data, num_values)) {
			PlainTemplatedInternal<VALUE_TYPE, CONVERSION, HAS_DEFINES, false>(plain_data, defines, num_values,
			                                                                   result_offset, result);
		} else {
			PlainTemplatedInternal<VALUE_TYPE, CONVERSION, HAS_DEFINES, true>(plain_data, defines, num_values,
			                                                                  result_offset, result);
		}
	}